

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O3

bool __thiscall MeCab::DecoderFeatureIndex::openBinaryModel(DecoderFeatureIndex *this,Param *param)

{
  uint *puVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  char *r;
  ostream *poVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  uint __fd;
  _Alloc_hider _Var9;
  size_t sVar10;
  string to;
  string modelfile;
  die local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Param::get<std::__cxx11::string>(&local_50,param,"model");
  _Var9._M_p = local_50._M_dataplus._M_p;
  iVar3 = Mmap<char>::open(&this->mmap_,local_50._M_dataplus._M_p,0x183d63);
  __fd = (uint)_Var9._M_p;
  if ((char)iVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"mmap_.open(modelfile.c_str())",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
    pcVar6 = whatlog::str(&(this->mmap_).what_);
    if (pcVar6 == (char *)0x0) {
      __fd = *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x20) | 1;
      std::ios::clear((int)poVar5 + (int)*(long *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
      __fd = (uint)pcVar6;
    }
    die::~die((die *)&local_70);
  }
  puVar1 = (uint *)(this->mmap_).text;
  sVar2 = (this->mmap_).length;
  uVar8 = (ulong)*puVar1;
  (this->super_FeatureIndex).maxid_ = uVar8;
  sVar10 = uVar8 * 0x10 + 0x24;
  if (sVar10 == sVar2) {
    this->charset_ = (char *)(puVar1 + 1);
    (this->super_FeatureIndex).alpha_ = (double *)(puVar1 + 9);
    this->key_ = (uint64_t *)(puVar1 + uVar8 * 2 + 9);
    Param::get<std::__cxx11::string>(&local_70,param,"charset");
    iVar3 = decode_charset(this->charset_);
    iVar4 = decode_charset(local_70._M_dataplus._M_p);
    if (iVar3 != iVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"decode_charset(charset_) == decode_charset(to.c_str())",0x36);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"model charset and dictionary charset are different. ",0x34);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"model_charset=",0xe);
      pcVar6 = this->charset_;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," dictionary_charset=",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
      die::~die(&local_71);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else {
    Mmap<char>::close(&this->mmap_,__fd);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return sVar10 == sVar2;
}

Assistant:

bool DecoderFeatureIndex::openBinaryModel(const Param &param) {
  const std::string modelfile = param.get<std::string>("model");
  CHECK_DIE(mmap_.open(modelfile.c_str())) << mmap_.what();
  if (!openFromArray(mmap_.begin(), mmap_.end())) {
    mmap_.close();
    return false;
  }
  const std::string to = param.get<std::string>("charset");
  CHECK_DIE(decode_charset(charset_) ==
            decode_charset(to.c_str()))
      << "model charset and dictionary charset are different. "
      << "model_charset=" << charset_
      << " dictionary_charset=" << to;

  return true;
}